

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool ReadMeshDoublePrecisionVertices(ON_BinaryArchive *file,ON_SimpleArray<ON_3dPoint> *dV)

{
  bool bVar1;
  bool bVar2;
  char *sFormat;
  int line_number;
  uint dVcount;
  bool bFailedCRC;
  int major_version;
  size_t sz;
  int minor_version;
  ON__UINT32 local_34;
  bool local_2d;
  int local_2c;
  size_t local_28;
  int local_1c;
  
  if (-1 < dV->m_capacity) {
    dV->m_count = 0;
  }
  local_2c = 0;
  local_1c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_2c,&local_1c);
  if (!bVar1) {
    return false;
  }
  if (local_2c == 1) {
    local_34 = 0;
    bVar1 = ON_BinaryArchive::ReadInt(file,&local_34);
    if (bVar1) {
      if (local_34 == 0) {
        bVar1 = true;
        goto LAB_005043b7;
      }
      local_28 = 0;
      bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_28);
      if (bVar1) {
        if (local_28 == (ulong)local_34 * 0x18) {
          ON_SimpleArray<ON_3dPoint>::SetCapacity(dV,(ulong)local_34);
          if ((-1 < (int)local_34) && ((int)local_34 <= dV->m_capacity)) {
            dV->m_count = local_34;
          }
          if ((dV->m_a != (ON_3dPoint *)0x0) && (local_34 == dV->m_count)) {
            local_2d = false;
            bVar1 = ON_BinaryArchive::ReadCompressedBuffer(file,local_28,dV->m_a,&local_2d);
            goto LAB_005043b7;
          }
          sFormat = "Unable to allocate double precision vertex point array.";
          line_number = 0x85f;
        }
        else {
          sFormat = "Compressed double precision vertex point buffer size is wrong.";
          line_number = 0x856;
        }
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,line_number,"",sFormat);
        goto LAB_005043b7;
      }
    }
  }
  bVar1 = false;
LAB_005043b7:
  if ((bVar1 == false) && (-1 < dV->m_capacity)) {
    dV->m_count = 0;
  }
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar1 & bVar2);
}

Assistant:

static
bool ReadMeshDoublePrecisionVertices( 
  ON_BinaryArchive& file, 
  ON_SimpleArray<ON_3dPoint>& dV 
  )
{
  dV.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  if ( !file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version) )
    return false;

  bool rc = false;
  for(;;)
  {
    if (1 != major_version)
      break;

    unsigned int dVcount = 0;
    if (!file.ReadInt(&dVcount))
      break;

    if (0 == dVcount)
    {
      rc = true;
      break;
    }

    size_t sz = 0;
    if (!file.ReadCompressedBufferSize( &sz ))
      break;

    if (sz != ((size_t)dVcount)*sizeof(ON_3dPoint))
    {
      ON_ERROR("Compressed double precision vertex point buffer size is wrong.");
      break;
    }

    dV.SetCapacity(dVcount);
    dV.SetCount(dVcount);
    ON_3dPoint* a = dV.Array();
    if (nullptr == a || dVcount != dV.UnsignedCount())
    {
      ON_ERROR("Unable to allocate double precision vertex point array.");
      break;
    }
    
    bool bFailedCRC = 0;
    if (!file.ReadCompressedBuffer( sz, a, &bFailedCRC))
      break;

    rc = true;
    break;
  }

  if (!rc)
    dV.SetCount(0);
  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}